

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

int32_t WebRtcAgc_ProcessDigital
                  (DigitalAgc *stt,int16_t **in_near,size_t num_bands,int16_t **out,uint32_t FS,
                  int16_t lowlevelSignal)

{
  int *piVar1;
  short sVar2;
  ushort uVar3;
  int16_t iVar4;
  uint32_t uVar5;
  int16_t *piVar6;
  byte bVar7;
  short sVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  int iVar16;
  uint32_t uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long lStack_a0;
  sbyte local_94;
  int32_t gains [11];
  int32_t env [10];
  
  if (FS == 8000) {
    local_94 = 1;
    lStack_a0 = 8;
  }
  else {
    if (((FS != 16000) && (FS != 48000)) && (FS != 32000)) {
      return -1;
    }
    local_94 = 0;
    lStack_a0 = 0x10;
  }
  for (sVar15 = 0; num_bands != sVar15; sVar15 = sVar15 + 1) {
    if (in_near[sVar15] != out[sVar15]) {
      memcpy(out[sVar15],in_near[sVar15],lStack_a0 * 0x14);
    }
  }
  sVar2 = WebRtcAgc_ProcessVad(&stt->vadNearend,*out,lStack_a0 * 10);
  if (10 < (stt->vadFarend).counter) {
    sVar2 = (short)((uint)(sVar2 * 3 - (int)(stt->vadFarend).logRatio) >> 2);
  }
  sVar8 = -0x41;
  if (sVar2 < 0x401) {
    if (sVar2 < 0) {
      sVar8 = 0;
    }
    else {
      sVar8 = (short)((uint)(-sVar2 * 0x41) >> 10);
    }
  }
  if (stt->agcMode != 3) {
    uVar3 = (stt->vadNearend).stdLongTerm;
    sVar2 = 0;
    if ((3999 < (short)uVar3) && (sVar2 = sVar8, uVar3 < 0x1fa0)) {
      sVar2 = (short)((int)sVar8 * (uint)(ushort)(uVar3 - 4000) >> 0xc);
    }
    sVar8 = 0;
    if (lowlevelSignal == 0) {
      sVar8 = sVar2;
    }
  }
  piVar6 = *out;
  for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
    iVar10 = 0;
    for (lVar14 = 0; lStack_a0 != lVar14; lVar14 = lVar14 + 1) {
      iVar16 = (int)piVar6[lVar14] * (int)piVar6[lVar14];
      if (iVar10 < iVar16) {
        iVar10 = iVar16;
      }
    }
    env[lVar13] = iVar10;
    piVar6 = (int16_t *)((long)piVar6 + (ulong)(uint)((int)lStack_a0 * 2));
  }
  gains[0] = stt->gain;
  uVar19 = 0;
  uVar18 = 0;
  for (lVar13 = 1; lVar13 != 0xb; lVar13 = lVar13 + 1) {
    uVar18 = stt->capacitorSlow;
    uVar9 = stt->capacitorFast;
    uVar5 = ((int)((uVar9 & 0xffff) * -1000) >> 0x10) + ((int)uVar9 >> 0x10) * -1000 + uVar9;
    uVar17 = env[lVar13 + -1];
    if ((int)uVar5 < (int)uVar17) {
      uVar5 = uVar17;
    }
    stt->capacitorFast = uVar5;
    uVar9 = uVar17 - uVar18;
    if (uVar9 == 0 || (int)uVar17 < (int)uVar18) {
      uVar17 = ((int)((uVar18 & 0xffff) * (int)sVar8) >> 0x10) +
               ((int)uVar18 >> 0x10) * (int)sVar8 + uVar18;
    }
    else {
      uVar17 = ((uVar9 & 0xffff) * 500 >> 0x10) + ((int)uVar9 >> 0x10) * 500 + uVar18;
    }
    stt->capacitorSlow = uVar17;
    if ((int)uVar17 < (int)uVar5) {
      uVar17 = uVar5;
    }
    uVar3 = NormU32(uVar17);
    uVar19 = (ulong)uVar3;
    if (uVar17 == 0) {
      uVar19 = 0x1f;
    }
    uVar18 = (uVar17 << ((byte)uVar19 & 0x1f)) >> 0x13 & 0xfff;
    gains[lVar13] =
         ((int)((stt->gainTable[uVar19 - 1] - stt->gainTable[uVar19]) * uVar18) >> 0xc) +
         stt->gainTable[uVar19];
  }
  iVar4 = NormU32(stt->capacitorFast);
  if (stt->capacitorFast == 0) {
    iVar4 = 0x1f;
  }
  sVar2 = (iVar4 * 0x200 -
          ((short)((int)uVar19 * 0x2000000 + (uVar18 & 0xff8) * -0x2000 >> 0x10) +
           (short)*(undefined4 *)&(stt->vadNearend).stdShortTerm +
          ((ushort)((uint)(stt->capacitorFast << ((byte)iVar4 & 0x1f)) >> 0x16) & 0x1ff))) + 1000;
  if (sVar2 < 0) {
    stt->gatePrevious = 0;
  }
  else {
    sVar2 = (short)((uint)(stt->gatePrevious * 7 + (int)sVar2) >> 3);
    stt->gatePrevious = sVar2;
    if (0 < sVar2) {
      iVar10 = (-((int)sVar2 - 0x9c4U) >> 5) + 0xb2;
      if (0x9c3 < (uint)(int)sVar2) {
        iVar10 = 0xb2;
      }
      iVar16 = stt->gainTable[0];
      for (lVar13 = 1; lVar13 != 0xb; lVar13 = lVar13 + 1) {
        uVar18 = gains[lVar13] - iVar16;
        iVar21 = (int)(uVar18 * iVar10) >> 8;
        if (0x800000 < (int)uVar18) {
          iVar21 = (uVar18 >> 8) * iVar10;
        }
        gains[lVar13] = iVar21 + iVar16;
      }
    }
  }
  lVar13 = 0;
  while (sVar2 = 10, lVar13 != 10) {
    uVar18 = gains[lVar13 + 1];
    if (0x2d413cc < (int)uVar18) {
      iVar4 = NormW32(uVar18);
      sVar2 = 0x10 - iVar4;
    }
    bVar7 = (byte)sVar2;
    iVar10 = ((int)uVar18 >> (bVar7 & 0x1f)) + 1;
    uVar11 = iVar10 * iVar10;
    piVar1 = env + lVar13;
    lVar13 = lVar13 + 1;
    iVar10 = (*piVar1 >> 0xc) + 1;
    uVar9 = 0x7fff >> (bVar7 * '\x02' - 0x16 & 0x1f);
    if (sVar2 < 0xc) {
      uVar9 = 0x7fff << (bVar7 * -2 + 0x16 & 0x1f);
    }
    while ((int)uVar9 < (int)(((int)((uVar11 & 0x1fff) * iVar10) >> 0xd) + (uVar11 >> 0xd) * iVar10)
          ) {
      if ((int)uVar18 < 0x800000) {
        uVar18 = (int)(uVar18 * 0xfd) / 0x100;
      }
      else {
        uVar18 = (uVar18 >> 8) * 0xfd;
      }
      gains[lVar13] = uVar18;
      iVar16 = ((int)uVar18 >> (bVar7 & 0x1f)) + 1;
      uVar11 = iVar16 * iVar16;
    }
  }
  for (lVar13 = 2; lVar13 != 0xb; lVar13 = lVar13 + 1) {
    iVar10 = gains[lVar13];
    if (gains[lVar13 + -1] < gains[lVar13]) {
      iVar10 = gains[lVar13 + -1];
    }
    gains[lVar13 + -1] = iVar10;
  }
  stt->gain = gains[10];
  iVar10 = gains[0] << 4;
  for (lVar13 = 0; lVar13 != lStack_a0; lVar13 = lVar13 + 1) {
    for (sVar15 = 0; num_bands != sVar15; sVar15 = sVar15 + 1) {
      iVar16 = (int)out[sVar15][lVar13];
      iVar21 = (iVar10 + 0x7f >> 7) * iVar16 >> 0x10;
      iVar4 = 0x7fff;
      if ((iVar21 < 0x1000) && (iVar4 = -0x8000, -0x1001 < iVar21)) {
        iVar4 = (int16_t)((uint)(iVar16 * (iVar10 >> 4)) >> 0x10);
      }
      out[sVar15][lVar13] = iVar4;
    }
    iVar10 = iVar10 + (gains[1] - gains[0] << local_94);
  }
  lVar13 = 1;
  while (lVar13 != 10) {
    lVar14 = lVar13 + 1;
    iVar10 = gains[lVar13];
    iVar16 = gains[lVar13 + 1];
    iVar21 = iVar10 << 4;
    lVar12 = lVar13 * lStack_a0;
    for (lVar20 = 0; lVar13 = lVar14, lVar20 != lStack_a0; lVar20 = lVar20 + 1) {
      for (sVar15 = 0; num_bands != sVar15; sVar15 = sVar15 + 1) {
        lVar13 = (long)out[sVar15][lVar12 + lVar20] * (long)(iVar21 >> 4) >> 0x10;
        if (lVar13 < -0x7fff) {
          lVar13 = -0x8000;
        }
        if (0x7ffe < lVar13) {
          lVar13 = 0x7fff;
        }
        out[sVar15][lVar12 + lVar20] = (int16_t)lVar13;
      }
      iVar21 = iVar21 + (iVar16 - iVar10 << local_94);
    }
  }
  return 0;
}

Assistant:

int32_t WebRtcAgc_ProcessDigital(DigitalAgc *stt, const int16_t *const *in_near, size_t num_bands, int16_t *const *out,
                                 uint32_t FS, int16_t lowlevelSignal) {
    // array for gains (one value per ms, incl start & end)
    int32_t gains[11];

    int32_t out_tmp, tmp32;
    int32_t env[10];
    int32_t max_nrg;
    int32_t cur_level;
    int32_t gain32, delta;
    int16_t logratio;
    int16_t lower_thr, upper_thr;
    int16_t zeros = 0, zeros_fast, frac = 0;
    int16_t decay;
    int16_t gate, gain_adj;
    int16_t k;
    size_t n, i, L;
    int16_t L2;  // samples/subframe

    // determine number of samples per ms
    if (FS == 8000) {
        L = 8;
        L2 = 3;
    } else if (FS == 16000 || FS == 32000 || FS == 48000) {
        L = 16;
        L2 = 4;
    } else {
        return -1;
    }

    for (i = 0; i < num_bands; ++i) {
        if (in_near[i] != out[i]) {
            // Only needed if they don't already point to the same place.
            memcpy(out[i], in_near[i], 10 * L * sizeof(in_near[i][0]));
        }
    }
    // VAD for near end
    logratio = WebRtcAgc_ProcessVad(&stt->vadNearend, out[0], L * 10);

    // Account for far end VAD
    if (stt->vadFarend.counter > 10) {
        tmp32 = 3 * logratio;
        logratio = (int16_t) ((tmp32 - stt->vadFarend.logRatio) >> 2);
    }

    // Determine decay factor depending on VAD
    //  upper_thr = 1.0f;
    //  lower_thr = 0.25f;
    upper_thr = 1024;  // Q10
    lower_thr = 0;     // Q10
    if (logratio > upper_thr) {
        // decay = -2^17 / DecayTime;  ->  -65
        decay = -65;
    } else if (logratio < lower_thr) {
        decay = 0;
    } else {
        // decay = (int16_t)(((lower_thr - logratio)
        //       * (2^27/(DecayTime*(upper_thr-lower_thr)))) >> 10);
        // SUBSTITUTED: 2^27/(DecayTime*(upper_thr-lower_thr))  ->  65
        tmp32 = (lower_thr - logratio) * 65;
        decay = (int16_t) (tmp32 >> 10);
    }

    // adjust decay factor for long silence (detected as low standard deviation)
    // This is only done in the adaptive modes
    if (stt->agcMode != kAgcModeFixedDigital) {
        if (stt->vadNearend.stdLongTerm < 4000) {
            decay = 0;
        } else if (stt->vadNearend.stdLongTerm < 8096) {
            // decay = (int16_t)(((stt->vadNearend.stdLongTerm - 4000) * decay) >>
            // 12);
            tmp32 = (stt->vadNearend.stdLongTerm - 4000) * decay;
            decay = (int16_t) (tmp32 >> 12);
        }

        if (lowlevelSignal != 0) {
            decay = 0;
        }
    }
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->frameCounter++;
    fprintf(stt->logFile, "%5.2f\t%d\t%d\t%d\t", (float)(stt->frameCounter) / 100, logratio, decay,
            stt->vadNearend.stdLongTerm);
#endif
    // Find max amplitude per sub frame
    // iterate over sub frames
    for (k = 0; k < 10; k++) {
        // iterate over samples
        max_nrg = 0;
        for (n = 0; n < L; n++) {
            int32_t nrg = out[0][k * L + n] * out[0][k * L + n];
            if (nrg > max_nrg) {
                max_nrg = nrg;
            }
        }
        env[k] = max_nrg;
    }

    // Calculate gain per sub frame
    gains[0] = stt->gain;
    for (k = 0; k < 10; k++) {
        // Fast envelope follower
        //  decay time = -131000 / -1000 = 131 (ms)
        stt->capacitorFast = AGC_SCALEDIFF32(-1000, stt->capacitorFast, stt->capacitorFast);
        if (env[k] > stt->capacitorFast) {
            stt->capacitorFast = env[k];
        }
        // Slow envelope follower
        if (env[k] > stt->capacitorSlow) {
            // increase capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(500, (env[k] - stt->capacitorSlow), stt->capacitorSlow);
        } else {
            // decrease capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(decay, stt->capacitorSlow, stt->capacitorSlow);
        }

        // use maximum of both capacitors as current level
        if (stt->capacitorFast > stt->capacitorSlow) {
            cur_level = stt->capacitorFast;
        } else {
            cur_level = stt->capacitorSlow;
        }
        // Translate signal level into gain, using a piecewise linear approximation
        // find number of leading zeros
        zeros = NormU32((uint32_t) cur_level);
        if (cur_level == 0) {
            zeros = 31;
        }
        tmp32 = ((uint32_t) cur_level << zeros) & 0x7FFFFFFF;
        frac = (int16_t) (tmp32 >> 19);  // Q12.
        tmp32 = (stt->gainTable[zeros - 1] - stt->gainTable[zeros]) * frac;
        gains[k + 1] = stt->gainTable[zeros] + (tmp32 >> 12);
#ifdef WEBRTC_AGC_DEBUG_DUMP
        if (k == 0) {
            fprintf(stt->logFile, "%d\t%d\t%d\t%d\t%d\n", env[0], cur_level, stt->capacitorFast, stt->capacitorSlow,
                    zeros);
        }
#endif
    }

    // Gate processing (lower gain during absence of speech)
    zeros = (zeros << 9) - (frac >> 3);
    // find number of leading zeros
    zeros_fast = NormU32((uint32_t) stt->capacitorFast);
    if (stt->capacitorFast == 0) {
        zeros_fast = 31;
    }
    tmp32 = ((uint32_t) stt->capacitorFast << zeros_fast) & 0x7FFFFFFF;
    zeros_fast <<= 9;
    zeros_fast -= (int16_t) (tmp32 >> 22);

    gate = 1000 + zeros_fast - zeros - stt->vadNearend.stdShortTerm;

    if (gate < 0) {
        stt->gatePrevious = 0;
    } else {
        tmp32 = stt->gatePrevious * 7;
        gate = (int16_t) ((gate + tmp32) >> 3);
        stt->gatePrevious = gate;
    }
    // gate < 0     -> no gate
    // gate > 2500  -> max gate
    if (gate > 0) {
        if (gate < 2500) {
            gain_adj = (2500 - gate) >> 5;
        } else {
            gain_adj = 0;
        }
        for (k = 0; k < 10; k++) {
            if ((gains[k + 1] - stt->gainTable[0]) > 8388608) {
                // To prevent wraparound
                tmp32 = (gains[k + 1] - stt->gainTable[0]) >> 8;
                tmp32 *= 178 + gain_adj;
            } else {
                tmp32 = (gains[k + 1] - stt->gainTable[0]) * (178 + gain_adj);
                tmp32 >>= 8;
            }
            gains[k + 1] = stt->gainTable[0] + tmp32;
        }
    }

    // Limit gain to avoid overload distortion
    for (k = 0; k < 10; k++) {
        // To prevent wrap around
        zeros = 10;
        if (gains[k + 1] > 47453132) {
            zeros = 16 - NormW32(gains[k + 1]);
        }
        gain32 = (gains[k + 1] >> zeros) + 1;
        gain32 *= gain32;
        // check for overflow
        while (AGC_MUL32((env[k] >> 12) + 1, gain32) > SHIFT_W32((int32_t) 32767, 2 * (1 - zeros + 10))) {
            // multiply by 253/256 ==> -0.1 dB
            if (gains[k + 1] > 8388607) {
                // Prevent wrap around
                gains[k + 1] = (gains[k + 1] / 256) * 253;
            } else {
                gains[k + 1] = (gains[k + 1] * 253) / 256;
            }
            gain32 = (gains[k + 1] >> zeros) + 1;
            gain32 *= gain32;
        }
    }
    // gain reductions should be done 1 ms earlier than gain increases
    for (k = 1; k < 10; k++) {
        if (gains[k] > gains[k + 1]) {
            gains[k] = gains[k + 1];
        }
    }
    // save start gain for next frame
    stt->gain = gains[10];

    // Apply gain
    // handle first sub frame separately
    delta = (gains[1] - gains[0]) * (1 << (4 - L2));
    gain32 = gains[0] * (1 << 4);
    // iterate over samples
    for (n = 0; n < L; n++) {
        for (i = 0; i < num_bands; ++i) {
            tmp32 = out[i][n] * ((gain32 + 127) >> 7);
            out_tmp = tmp32 >> 16;
            if (out_tmp > 4095) {
                out[i][n] = (int16_t) 32767;
            } else if (out_tmp < -4096) {
                out[i][n] = (int16_t) -32768;
            } else {
                tmp32 = out[i][n] * (gain32 >> 4);
                out[i][n] = (int16_t) (tmp32 >> 16);
            }
        }
        //

        gain32 += delta;
    }
    // iterate over subframes
    for (k = 1; k < 10; k++) {
        delta = (gains[k + 1] - gains[k]) * (1 << (4 - L2));
        gain32 = gains[k] * (1 << 4);
        // iterate over samples
        for (n = 0; n < L; n++) {
            for (i = 0; i < num_bands; ++i) {
                int64_t tmp64 = ((int64_t) (out[i][k * L + n])) * (gain32 >> 4);
                tmp64 = tmp64 >> 16;
                if (tmp64 > 32767) {
                    out[i][k * L + n] = 32767;
                } else if (tmp64 < -32768) {
                    out[i][k * L + n] = -32768;
                } else {
                    out[i][k * L + n] = (int16_t) (tmp64);
                }
            }
            gain32 += delta;
        }
    }

    return 0;
}